

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

int __thiscall LogOutput::remove(LogOutput *this,char *__filename)

{
  int extraout_EAX;
  enable_shared_from_this<LogOutput> local_28;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  LogOutput *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&sOutputsMutex);
  std::enable_shared_from_this<LogOutput>::shared_from_this(&local_28);
  Set<std::shared_ptr<LogOutput>_>::remove(&sOutputs,(char *)&local_28);
  std::shared_ptr<LogOutput>::~shared_ptr((shared_ptr<LogOutput> *)&local_28);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return extraout_EAX;
}

Assistant:

void LogOutput::remove()
{
    std::lock_guard<std::mutex> lock(sOutputsMutex);
    sOutputs.remove(shared_from_this());
}